

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

bool __thiscall
slang::parsing::Preprocessor::applyMacroOps
          (Preprocessor *this,span<const_slang::parsing::Token,_18446744073709551615UL> tokens,
          SmallVectorBase<slang::parsing::Token> *dest)

{
  string_view arg;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_00;
  string_view rawText;
  Token sourceToken;
  string_view strText;
  Token right_00;
  Token right_01;
  Token right_02;
  span<slang::parsing::Token,_18446744073709551615UL> tokens_00;
  Token startToken;
  Token startToken_00;
  Token endToken;
  Token endToken_00;
  Token endToken_01;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens_01;
  ulong uVar1;
  bool bVar2;
  SyntaxKind SVar3;
  size_type sVar5;
  reference peVar6;
  int iVar4;
  reference pTVar7;
  undefined4 extraout_var;
  const_reference pvVar8;
  Preprocessor *in_RCX;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> in_RSI;
  pointer in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  Token left_00;
  Token TVar10;
  Trivia TVar11;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar12;
  Token TVar13;
  string_view sVar14;
  basic_string_view<char,_std::char_traits<char>_> bVar15;
  basic_string_view<char,_std::char_traits<char>_> bVar16;
  Token TVar17;
  SmallVector<slang::parsing::Token,_8UL> splits;
  bool endIsTriple;
  bool startIsTriple;
  size_t offset;
  string_view raw;
  Token right;
  Token left;
  Token token;
  bool nextDidConcat;
  Token newToken;
  size_t i;
  bool didConcat;
  bool anyNewMacros;
  Token extraToAppend;
  Token syntheticComment;
  Token stringify;
  SmallVector<slang::parsing::Token,_8UL> commentBuffer;
  SmallVector<slang::parsing::Token,_8UL> stringifyBuffer;
  SmallVector<slang::parsing::Trivia,_8UL> emptyArgTrivia;
  Token *in_stack_fffffffffffff648;
  Token *__len;
  Preprocessor *in_stack_fffffffffffff650;
  Preprocessor *this_00;
  SourceLocation in_stack_fffffffffffff658;
  SmallVectorBase<slang::parsing::Trivia> *in_stack_fffffffffffff660;
  DiagCode code;
  char *in_stack_fffffffffffff668;
  undefined7 in_stack_fffffffffffff670;
  undefined1 in_stack_fffffffffffff677;
  byte bVar18;
  undefined6 in_stack_fffffffffffff680;
  undefined1 in_stack_fffffffffffff686;
  undefined1 in_stack_fffffffffffff687;
  BumpAllocator *in_stack_fffffffffffff688;
  Preprocessor *in_stack_fffffffffffff690;
  undefined6 in_stack_fffffffffffff698;
  TokenKind in_stack_fffffffffffff69e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff6a0;
  Preprocessor *in_stack_fffffffffffff6a8;
  SourceLocation in_stack_fffffffffffff6b0;
  Info *in_stack_fffffffffffff6b8;
  undefined8 in_stack_fffffffffffff6c0;
  char *in_stack_fffffffffffff6d0;
  size_t in_stack_fffffffffffff6d8;
  char *in_stack_fffffffffffff6e0;
  size_t in_stack_fffffffffffff6e8;
  bool local_869;
  byte local_759;
  BumpAllocator local_690 [9];
  Token *local_5f8;
  Preprocessor *pPStack_5f0;
  Token *local_5e8;
  Preprocessor *pPStack_5e0;
  Token *local_5c8;
  Preprocessor *pPStack_5c0;
  Token local_5b8;
  basic_string_view<char,_std::char_traits<char>_> local_5a8;
  Token local_598;
  basic_string_view<char,_std::char_traits<char>_> local_588;
  undefined1 local_572;
  byte local_571;
  size_type local_570;
  string_view local_568;
  undefined8 local_558;
  undefined8 local_550;
  undefined8 local_548;
  Token local_528;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_518;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_508;
  Token *local_4f8;
  Preprocessor *pPStack_4f0;
  undefined8 local_4e8;
  Info *pIStack_4e0;
  Token local_4d8;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_4c8;
  undefined8 local_4b8;
  Info *pIStack_4b0;
  undefined8 local_4a8;
  Info *pIStack_4a0;
  Token local_498;
  Token local_478;
  undefined8 local_468;
  Info *local_460;
  undefined8 local_458;
  Info *pIStack_450;
  undefined8 local_448;
  Info *local_440;
  undefined6 local_438;
  undefined2 uStack_432;
  undefined6 local_430;
  undefined2 uStack_42a;
  undefined6 local_418;
  undefined2 local_412;
  undefined6 uStack_410;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_408;
  undefined8 local_3f8;
  Info *pIStack_3f0;
  undefined8 local_3e8;
  Info *pIStack_3e0;
  undefined8 in_stack_fffffffffffffc28;
  Info *in_stack_fffffffffffffc30;
  SourceLocation in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  pointer in_stack_fffffffffffffc48;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc50;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc58;
  SourceLocation local_378;
  SmallVectorBase<slang::parsing::Trivia> *pSStack_370;
  Token *local_358;
  Preprocessor *pPStack_350;
  undefined8 local_338;
  undefined8 local_330;
  Token *local_328;
  Preprocessor *pPStack_320;
  Token *local_2d8;
  Preprocessor *local_2d0;
  Preprocessor *in_stack_fffffffffffffd40;
  span<slang::parsing::Token,_18446744073709551615UL> in_stack_fffffffffffffd48;
  Token *in_stack_fffffffffffffd58;
  Preprocessor *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd80;
  SourceLocation in_stack_fffffffffffffd88;
  Token *local_268;
  Preprocessor *pPStack_260;
  byte local_249;
  Token local_248;
  ulong local_238;
  byte local_22a;
  byte local_229;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  Info *pIStack_210;
  Token *local_1f8;
  Preprocessor *pPStack_1f0;
  SmallVectorBase<slang::parsing::Token> local_1e8 [3];
  SmallVectorBase<slang::parsing::Token> local_150 [3];
  SmallVectorBase<slang::parsing::Trivia> local_b8 [3];
  SmallVectorBase<slang::parsing::Token> *in_stack_ffffffffffffffd8;
  pointer pTVar19;
  
  pTVar19 = in_RDI;
  SmallVector<slang::parsing::Trivia,_8UL>::SmallVector
            ((SmallVector<slang::parsing::Trivia,_8UL> *)0x28c664);
  SmallVector<slang::parsing::Token,_8UL>::SmallVector
            ((SmallVector<slang::parsing::Token,_8UL> *)0x28c671);
  SmallVector<slang::parsing::Token,_8UL>::SmallVector
            ((SmallVector<slang::parsing::Token,_8UL> *)0x28c67e);
  Token::Token((Token *)in_stack_fffffffffffff650);
  Token::Token((Token *)in_stack_fffffffffffff650);
  Token::Token((Token *)in_stack_fffffffffffff650);
  left_00.info = (Info *)in_stack_fffffffffffffc50._M_extent_value;
  left_00._0_8_ = in_stack_fffffffffffffc48;
  TVar10.info = in_stack_fffffffffffffc30;
  TVar10.kind = (short)in_stack_fffffffffffffc28;
  TVar10._2_1_ = (char)((ulong)in_stack_fffffffffffffc28 >> 0x10);
  TVar10.numFlags.raw = (char)((ulong)in_stack_fffffffffffffc28 >> 0x18);
  TVar10.rawLen = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  bVar15._M_str = in_stack_fffffffffffff6e0;
  bVar15._M_len = in_stack_fffffffffffff6e8;
  bVar16._M_str = in_stack_fffffffffffff6d0;
  bVar16._M_len = in_stack_fffffffffffff6d8;
  TVar17.info = in_stack_fffffffffffff6b8;
  TVar17.kind = (short)in_stack_fffffffffffff6c0;
  TVar17._2_1_ = (char)((ulong)in_stack_fffffffffffff6c0 >> 0x10);
  TVar17.numFlags.raw = (char)((ulong)in_stack_fffffffffffff6c0 >> 0x18);
  TVar17.rawLen = (int)((ulong)in_stack_fffffffffffff6c0 >> 0x20);
  local_229 = 0;
  local_22a = 0;
  local_238 = 0;
  local_378 = in_stack_fffffffffffff658;
  pSStack_370 = in_stack_fffffffffffff660;
  do {
    uVar1 = local_238;
    sVar5 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::size
                      ((span<const_slang::parsing::Token,_18446744073709551615UL> *)0x28c6e4);
    if (sVar5 <= uVar1) {
      bVar2 = Token::operator_cast_to_bool((Token *)0x28de4b);
      code = SUB84((ulong)pSStack_370 >> 0x20,0);
      if (bVar2) {
        Token::location((Token *)&local_1f8);
        addDiag(in_stack_fffffffffffff650,code,local_378);
      }
      bVar18 = local_229;
      SmallVector<slang::parsing::Token,_8UL>::~SmallVector
                ((SmallVector<slang::parsing::Token,_8UL> *)0x28debf);
      SmallVector<slang::parsing::Token,_8UL>::~SmallVector
                ((SmallVector<slang::parsing::Token,_8UL> *)0x28decc);
      SmallVector<slang::parsing::Trivia,_8UL>::~SmallVector
                ((SmallVector<slang::parsing::Trivia,_8UL> *)0x28ded9);
      return (bool)(bVar18 & 1);
    }
    Token::Token((Token *)in_stack_fffffffffffff650);
    local_249 = 0;
    peVar6 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                       ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                        &stack0xfffffffffffffff0,local_238);
    uVar1 = local_238;
    local_268 = *(Token **)peVar6;
    pPStack_260 = (Preprocessor *)peVar6->info;
    if ((ushort)((short)local_268 - 0x15aU) < 2) {
      bVar2 = Token::operator_cast_to_bool((Token *)0x28c78f);
      if (bVar2) {
        if ((TokenKind)local_268 == (TokenKind)local_1f8) {
          SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
          ::back((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                  *)&in_RDI[0xf].info);
          std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>::
          operator*((unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                     *)in_stack_fffffffffffff650);
          in_stack_fffffffffffffd58 = local_1f8;
          in_stack_fffffffffffffd60 = pPStack_1f0;
          std::span<slang::parsing::Token,_18446744073709551615UL>::
          span<slang::SmallVector<slang::parsing::Token,_8UL>_&>
                    ((span<slang::parsing::Token,_18446744073709551615UL> *)pSStack_370,
                     (SmallVector<slang::parsing::Token,_8UL> *)local_378);
          startToken.info = (Info *)in_stack_fffffffffffffd60;
          startToken._0_8_ = in_stack_fffffffffffffd58;
          endToken.info = (Info *)in_stack_fffffffffffffd88;
          endToken._0_8_ = in_stack_fffffffffffffd80;
          in_stack_fffffffffffff648 = local_268;
          in_stack_fffffffffffff650 = pPStack_260;
          in_stack_fffffffffffffd40 = pPStack_260;
          TVar13 = Lexer::stringify((Lexer *)pPStack_260,startToken,in_stack_fffffffffffffd48,
                                    endToken);
          local_248 = TVar13;
          Token::Token((Token *)in_stack_fffffffffffff650);
          local_1f8 = local_2d8;
          pPStack_1f0 = local_2d0;
        }
        else if ((TokenKind)local_1f8 == MacroTripleQuote) {
          local_248.info = (Info *)pPStack_260;
          local_248._0_8_ = local_268;
        }
        else {
          SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
          ::back((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                  *)&in_RDI[0xf].info);
          std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>::
          operator*((unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                     *)in_stack_fffffffffffff650);
          std::span<slang::parsing::Token,_18446744073709551615UL>::
          span<slang::SmallVector<slang::parsing::Token,_8UL>_&>
                    ((span<slang::parsing::Token,_18446744073709551615UL> *)pSStack_370,
                     (SmallVector<slang::parsing::Token,_8UL> *)local_378);
          TVar13.info = (Info *)in_stack_fffffffffffffd60;
          TVar13._0_8_ = in_stack_fffffffffffffd58;
          endToken_00.info = (Info *)in_stack_fffffffffffffd88;
          endToken_00._0_8_ = in_stack_fffffffffffffd80;
          __len = local_268;
          this_00 = pPStack_260;
          TVar13 = Lexer::stringify((Lexer *)in_stack_fffffffffffffd40,TVar13,
                                    in_stack_fffffffffffffd48,endToken_00);
          local_248 = TVar13;
          Token::Token((Token *)this_00);
          local_1f8 = local_328;
          pPStack_1f0 = pPStack_320;
          std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
                    ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x28cb41);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)pSStack_370,
                     (char *)local_378);
          Token::location((Token *)&local_268);
          SourceLocation::operator+<int>((SourceLocation *)local_378,(int)((ulong)this_00 >> 0x20));
          bVar9 = sv((char *)this_00,(size_t)__len);
          local_378 = (SourceLocation)bVar9._M_len;
          pSStack_370 = (SmallVectorBase<slang::parsing::Trivia> *)bVar9._M_str;
          sVar12._M_extent._M_extent_value = TVar17._0_8_;
          sVar12._M_ptr = (pointer)TVar17.info;
          sVar14._M_str = (char *)bVar16._M_len;
          sVar14._M_len = (size_t)bVar16._M_str;
          strText._M_str = (char *)bVar15._M_len;
          strText._M_len = (size_t)bVar15._M_str;
          in_stack_fffffffffffff648 = local_358;
          in_stack_fffffffffffff650 = pPStack_350;
          Token::Token((Token *)in_stack_fffffffffffff6a8,
                       (BumpAllocator *)in_stack_fffffffffffff6a0._M_extent_value,
                       in_stack_fffffffffffff69e,sVar12,sVar14,in_stack_fffffffffffff6b0,strText);
          local_228 = local_338;
          local_220 = local_330;
        }
      }
      else {
        local_1f8 = local_268;
        pPStack_1f0 = pPStack_260;
        SmallVectorBase<slang::parsing::Token>::clear
                  ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650);
        if (((TokenKind)local_268 == MacroTripleQuote) && (*(int *)((long)&in_RDI[1].info + 4) < 1))
        {
          in_stack_fffffffffffffd88 = Token::location((Token *)&local_268);
          addDiag(in_stack_fffffffffffff650,SUB84((ulong)pSStack_370 >> 0x20,0),local_378);
          sVar14 = slang::toString(Default);
          in_stack_fffffffffffffd80 = sVar14._M_str;
          arg._M_len._6_2_ = in_stack_fffffffffffff69e;
          arg._M_len._0_6_ = in_stack_fffffffffffff698;
          arg._M_str = (char *)in_stack_fffffffffffff6a0._M_extent_value;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff690,arg);
        }
      }
    }
    else if ((short)local_268 == 0x15d) {
      local_759 = 1;
      if (local_238 != 0) {
        sVar5 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::size
                          ((span<const_slang::parsing::Token,_18446744073709551615UL> *)0x28cc74);
        local_759 = 1;
        if (uVar1 != sVar5 - 1) {
          Token::trivia((Token *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670));
          bVar2 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                            ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x28cce1)
          ;
          local_759 = 1;
          if (bVar2) {
            std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                      ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                       &stack0xfffffffffffffff0,local_238 + 1);
            Token::trivia((Token *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670));
            bVar2 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                              ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
                               0x28cd55);
            local_759 = 1;
            if (bVar2) {
              bVar2 = SmallVectorBase<slang::parsing::Trivia>::empty(local_b8);
              local_759 = bVar2 ^ 0xff;
            }
          }
        }
      }
      if ((local_759 & 1) == 0) {
        bVar2 = Token::operator_cast_to_bool((Token *)0x28ce45);
        if (bVar2) {
          bVar2 = SmallVectorBase<slang::parsing::Token>::empty(local_150);
          if (!bVar2) {
            peVar6 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                               ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                                &stack0xfffffffffffffff0,local_238 + 1);
            if (peVar6->kind != MacroQuote) {
              peVar6 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                                 ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                                  &stack0xfffffffffffffff0,local_238 + 1);
              if (peVar6->kind != MacroTripleQuote) {
                pTVar7 = SmallVectorBase<slang::parsing::Token>::back(local_150);
                local_3e8._0_2_ = pTVar7->kind;
                local_3e8._2_1_ = pTVar7->field_0x2;
                local_3e8._3_1_ = pTVar7->numFlags;
                local_3e8._4_4_ = pTVar7->rawLen;
                pIStack_3e0 = pTVar7->info;
                peVar6 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                                   ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                                    &stack0xfffffffffffffff0,local_238 + 1);
                local_3f8._0_2_ = peVar6->kind;
                local_3f8._2_1_ = peVar6->field_0x2;
                local_3f8._3_1_ = peVar6->numFlags;
                local_3f8._4_4_ = peVar6->rawLen;
                pIStack_3f0 = peVar6->info;
                right_00.info._0_4_ = in_stack_fffffffffffffc40;
                right_00._0_8_ = in_stack_fffffffffffffc38;
                right_00.info._4_4_ = in_stack_fffffffffffffc44;
                TVar10 = Lexer::concatenateTokens
                                   ((BumpAllocator *)TVar10.info,TVar10._0_8_,left_00,right_00);
                local_248 = TVar10;
                bVar2 = Token::operator_cast_to_bool((Token *)0x28cff4);
                if (bVar2) {
                  SmallVectorBase<slang::parsing::Token>::pop_back
                            ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650);
                  local_238 = local_238 + 1;
                }
                goto LAB_0028d714;
              }
            }
          }
          in_stack_fffffffffffffc44 = 0x230004;
          in_stack_fffffffffffffc38 = Token::location((Token *)&local_268);
          addDiag(in_stack_fffffffffffff650,SUB84((ulong)pSStack_370 >> 0x20,0),local_378);
        }
        else {
          bVar2 = Token::operator_cast_to_bool((Token *)0x28d041);
          if (bVar2) {
            pTVar7 = SmallVectorBase<slang::parsing::Token>::back(local_1e8);
            if (pTVar7->kind == Star) {
              peVar6 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                                 ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                                  &stack0xfffffffffffffff0,local_238 + 1);
              if (peVar6->kind == Slash) {
                std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                          ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                           &stack0xfffffffffffffff0,local_238 + 1);
                SmallVectorBase<slang::parsing::Token>::push_back
                          ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650,
                           in_stack_fffffffffffff648);
                local_238 = local_238 + 1;
                sVar12 = Token::trivia((Token *)CONCAT17(in_stack_fffffffffffff677,
                                                         in_stack_fffffffffffff670));
                local_408 = sVar12;
                SmallVectorBase<slang::parsing::Trivia>::
                append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                          (pSStack_370,
                           (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)local_378);
                std::span<slang::parsing::Token,_18446744073709551615UL>::
                span<slang::SmallVector<slang::parsing::Token,_8UL>_&>
                          ((span<slang::parsing::Token,_18446744073709551615UL> *)pSStack_370,
                           (SmallVector<slang::parsing::Token,_8UL> *)local_378);
                tokens_00._M_extent._M_extent_value = in_stack_fffffffffffffc58._M_extent_value;
                tokens_00._M_ptr = (pointer)left_00.info;
                TVar11 = Lexer::commentify((BumpAllocator *)left_00._0_8_,
                                           (SourceManager *)
                                           CONCAT44(in_stack_fffffffffffffc44,
                                                    in_stack_fffffffffffffc40),tokens_00);
                local_438 = TVar11.field_0._0_6_;
                uStack_432 = TVar11.field_0._6_2_;
                local_430 = TVar11._8_6_;
                uStack_42a = TVar11._14_2_;
                uStack_410 = local_430;
                local_418 = local_438;
                local_412 = uStack_432;
                SmallVectorBase<slang::parsing::Trivia>::push_back
                          ((SmallVectorBase<slang::parsing::Trivia> *)in_stack_fffffffffffff650,
                           (Trivia *)in_stack_fffffffffffff648);
                Token::Token((Token *)in_stack_fffffffffffff650);
                local_218 = local_448;
                pIStack_210 = local_440;
              }
            }
          }
          else {
            pTVar7 = SmallVectorBase<slang::parsing::Token>::back
                               ((SmallVectorBase<slang::parsing::Token> *)in_RCX);
            local_458._0_2_ = pTVar7->kind;
            local_458._2_1_ = pTVar7->field_0x2;
            local_458._3_1_ = pTVar7->numFlags;
            local_458._4_4_ = pTVar7->rawLen;
            pIStack_450 = pTVar7->info;
            peVar6 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                               ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                                &stack0xfffffffffffffff0,local_238 + 1);
            local_468._0_2_ = peVar6->kind;
            local_468._2_1_ = peVar6->field_0x2;
            local_468._3_1_ = peVar6->numFlags;
            local_468._4_4_ = peVar6->rawLen;
            local_460 = peVar6->info;
            if (((short)local_458 == 0x1a) && ((undefined2)local_468 == 0x1b)) {
              SmallVectorBase<slang::parsing::Token>::clear
                        ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650);
              local_218 = local_458;
              pIStack_210 = pIStack_450;
              SmallVectorBase<slang::parsing::Token>::pop_back
                        ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650);
              local_238 = local_238 + 1;
              std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
                        ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x28d313);
              trivia._M_ptr._6_2_ = in_stack_fffffffffffff69e;
              trivia._M_ptr._0_6_ = in_stack_fffffffffffff698;
              trivia._M_extent._M_extent_value = in_stack_fffffffffffff6a0._M_extent_value;
              TVar13 = Token::withTrivia((Token *)in_stack_fffffffffffff690,
                                         in_stack_fffffffffffff688,trivia);
              local_478 = TVar13;
              SmallVectorBase<slang::parsing::Token>::push_back
                        ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650,
                         in_stack_fffffffffffff648);
              local_248.info = local_460;
              local_248.kind = (undefined2)local_468;
              local_248._2_1_ = local_468._2_1_;
              local_248.numFlags.raw = local_468._3_1_;
              local_248.rawLen = local_468._4_4_;
            }
            else {
              pTVar7 = SmallVectorBase<slang::parsing::Token>::back
                                 ((SmallVectorBase<slang::parsing::Token> *)in_RCX);
              local_4a8._0_2_ = pTVar7->kind;
              local_4a8._2_1_ = pTVar7->field_0x2;
              local_4a8._3_1_ = pTVar7->numFlags;
              local_4a8._4_4_ = pTVar7->rawLen;
              pIStack_4a0 = pTVar7->info;
              peVar6 = std::span<const_slang::parsing::Token,_18446744073709551615UL>::operator[]
                                 ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                                  &stack0xfffffffffffffff0,local_238 + 1);
              local_4b8._0_2_ = peVar6->kind;
              local_4b8._2_1_ = peVar6->field_0x2;
              local_4b8._3_1_ = peVar6->numFlags;
              local_4b8._4_4_ = peVar6->rawLen;
              pIStack_4b0 = peVar6->info;
              right_01.info._0_4_ = in_stack_fffffffffffffc40;
              right_01._0_8_ = in_stack_fffffffffffffc38;
              right_01.info._4_4_ = in_stack_fffffffffffffc44;
              TVar13 = Lexer::concatenateTokens
                                 ((BumpAllocator *)TVar10.info,TVar10._0_8_,left_00,right_01);
              local_498 = TVar13;
              local_248 = TVar13;
              bVar2 = Token::operator_cast_to_bool((Token *)0x28d496);
              if (bVar2) {
                SmallVectorBase<slang::parsing::Token>::pop_back
                          ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650);
                local_238 = local_238 + 1;
                local_249 = 1;
                bVar2 = false;
                if (local_248.kind == Directive) {
                  SVar3 = Token::directiveKind((Token *)in_stack_fffffffffffff650);
                  bVar2 = SVar3 == MacroUsage;
                }
                local_229 = (local_229 & 1) != 0 || bVar2;
              }
            }
          }
        }
      }
      else {
        in_stack_fffffffffffffc58._M_extent_value = (size_t)Token::location((Token *)&local_268);
        addDiag(in_stack_fffffffffffff650,SUB84((ulong)pSStack_370 >> 0x20,0),local_378);
        left_00 = (Token)Token::trivia((Token *)CONCAT17(in_stack_fffffffffffff677,
                                                         in_stack_fffffffffffff670));
        SmallVectorBase<slang::parsing::Trivia>::
        append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                  (pSStack_370,
                   (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)local_378);
      }
    }
    else {
      local_869 = false;
      if ((local_22a & 1) != 0) {
        sVar12 = Token::trivia((Token *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670
                                                ));
        local_4c8 = sVar12;
        bVar2 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                          ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x28d5b0);
        local_869 = false;
        if (bVar2) {
          local_869 = SmallVectorBase<slang::parsing::Trivia>::empty(local_b8);
        }
      }
      if (local_869 != false) {
        pTVar7 = SmallVectorBase<slang::parsing::Token>::back
                           ((SmallVectorBase<slang::parsing::Token> *)in_RCX);
        local_4e8._0_2_ = pTVar7->kind;
        local_4e8._2_1_ = pTVar7->field_0x2;
        local_4e8._3_1_ = pTVar7->numFlags;
        local_4e8._4_4_ = pTVar7->rawLen;
        pIStack_4e0 = pTVar7->info;
        local_4f8 = local_268;
        pPStack_4f0 = pPStack_260;
        right_02.info._0_4_ = in_stack_fffffffffffffc40;
        right_02._0_8_ = in_stack_fffffffffffffc38;
        right_02.info._4_4_ = in_stack_fffffffffffffc44;
        TVar13 = Lexer::concatenateTokens
                           ((BumpAllocator *)TVar10.info,TVar10._0_8_,left_00,right_02);
        local_4d8 = TVar13;
        local_248 = TVar13;
        bVar2 = Token::operator_cast_to_bool((Token *)0x28d6c3);
        if (bVar2) {
          SmallVectorBase<slang::parsing::Token>::pop_back
                    ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650);
          local_249 = 1;
          goto LAB_0028d714;
        }
      }
      local_248.info = (Info *)pPStack_260;
      local_248._0_8_ = local_268;
    }
LAB_0028d714:
    local_22a = local_249 & 1;
    bVar2 = Token::operator_cast_to_bool((Token *)0x28d731);
    if (bVar2) {
      if (local_248.kind == EmptyMacroArgument) {
        sVar12 = Token::trivia((Token *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670
                                                ));
        local_508 = sVar12;
        SmallVectorBase<slang::parsing::Trivia>::
        append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                  (pSStack_370,
                   (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)local_378);
      }
      else {
        bVar2 = SmallVectorBase<slang::parsing::Trivia>::empty(local_b8);
        if (!bVar2) {
          sVar12 = Token::trivia((Token *)CONCAT17(in_stack_fffffffffffff677,
                                                   in_stack_fffffffffffff670));
          local_518 = sVar12;
          SmallVectorBase<slang::parsing::Trivia>::
          append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                    (pSStack_370,
                     (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)local_378);
          iVar4 = SmallVectorBase<slang::parsing::Trivia>::copy
                            (local_b8,(EVP_PKEY_CTX *)in_RDI->info,src);
          local_548 = CONCAT44(extraout_var,iVar4);
          std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
          span<slang::parsing::Trivia,_18446744073709551615UL>
                    ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)pSStack_370,
                     (span<slang::parsing::Trivia,_18446744073709551615UL> *)local_378);
          trivia_00._M_ptr._6_2_ = in_stack_fffffffffffff69e;
          trivia_00._M_ptr._0_6_ = in_stack_fffffffffffff698;
          trivia_00._M_extent._M_extent_value = in_stack_fffffffffffff6a0._M_extent_value;
          TVar13 = Token::withTrivia((Token *)in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                                     trivia_00);
          local_528 = TVar13;
          local_248 = TVar13;
          SmallVectorBase<slang::parsing::Trivia>::clear
                    ((SmallVectorBase<slang::parsing::Trivia> *)in_stack_fffffffffffff650);
        }
        bVar2 = Token::operator_cast_to_bool((Token *)0x28d917);
        if (bVar2) {
          sVar14 = Token::rawText((Token *)pSStack_370);
          local_568 = sVar14;
          if (local_248.kind == Identifier) {
            bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_568);
            if (!bVar2) {
              pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 (&local_568,0);
              if (*pvVar8 == '\\') {
                local_570 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670)
                                       ,in_stack_fffffffffffff668,(size_type)pSStack_370);
                if (local_570 != 0xffffffffffffffff) {
                  local_571 = (TokenKind)local_1f8 == MacroTripleQuote;
                  bVar15 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                     ((basic_string_view<char,_std::char_traits<char>_> *)
                                      CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670),
                                      (size_type)in_stack_fffffffffffff668,(size_type)pSStack_370);
                  local_588 = bVar15;
                  local_572 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         pSStack_370,(char *)local_378);
                  if (((local_571 & 1) == local_572) || ((local_571 & 1) == 0)) {
                    bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                       ((basic_string_view<char,_std::char_traits<char>_> *)
                                        CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670
                                                ),(size_type)in_stack_fffffffffffff668,
                                        (size_type)pSStack_370);
                    rawText._M_len._6_2_ = in_stack_fffffffffffff69e;
                    rawText._M_len._0_6_ = in_stack_fffffffffffff698;
                    rawText._M_str = (char *)in_stack_fffffffffffff6a0._M_extent_value;
                    local_5a8 = bVar16;
                    TVar17 = Token::withRawText((Token *)in_stack_fffffffffffff690,
                                                in_stack_fffffffffffff688,rawText);
                    in_stack_fffffffffffff6a8 = in_RCX;
                    local_598 = TVar17;
                    SmallVectorBase<slang::parsing::Token>::push_back
                              ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650,
                               in_stack_fffffffffffff648);
                    in_RCX = in_stack_fffffffffffff6a8;
                    in_stack_fffffffffffff6b0 =
                         (SourceLocation)
                         SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                         ::back((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                 *)&in_RDI[0xf].info);
                    in_stack_fffffffffffff6a0._M_extent_value =
                         (size_t)std::
                                 unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                                 ::operator*((unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                                              *)in_stack_fffffffffffff650);
                    local_5c8 = local_1f8;
                    pPStack_5c0 = pPStack_1f0;
                    std::span<slang::parsing::Token,_18446744073709551615UL>::
                    span<slang::SmallVector<slang::parsing::Token,_8UL>_&>
                              ((span<slang::parsing::Token,_18446744073709551615UL> *)pSStack_370,
                               (SmallVector<slang::parsing::Token,_8UL> *)local_378);
                    Token::Token((Token *)in_stack_fffffffffffff650);
                    startToken_00.info = (Info *)in_stack_fffffffffffffd60;
                    startToken_00._0_8_ = in_stack_fffffffffffffd58;
                    endToken_01.info = (Info *)in_stack_fffffffffffffd88;
                    endToken_01._0_8_ = in_stack_fffffffffffffd80;
                    in_stack_fffffffffffff648 = local_5e8;
                    in_stack_fffffffffffff650 = pPStack_5e0;
                    TVar13 = Lexer::stringify((Lexer *)in_stack_fffffffffffffd40,startToken_00,
                                              in_stack_fffffffffffffd48,endToken_01);
                    in_stack_fffffffffffff690 = (Preprocessor *)TVar13.info;
                    in_stack_fffffffffffff698 = TVar13._0_6_;
                    in_stack_fffffffffffff69e = TVar13.rawLen._2_2_;
                    local_5b8 = TVar13;
                    SmallVectorBase<slang::parsing::Token>::push_back
                              ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650,
                               in_stack_fffffffffffff648);
                    Token::Token((Token *)in_stack_fffffffffffff650);
                    local_1f8 = local_5f8;
                    pPStack_1f0 = pPStack_5f0;
                    in_stack_fffffffffffff688 = local_690;
                    SmallVector<slang::parsing::Token,_8UL>::SmallVector
                              ((SmallVector<slang::parsing::Token,_8UL> *)0x28dd21);
                    sourceToken.rawLen._2_2_ = in_stack_fffffffffffff69e;
                    sourceToken._0_6_ = in_stack_fffffffffffff698;
                    sourceToken.info = (Info *)in_stack_fffffffffffff6a0._M_extent_value;
                    splitTokens(in_stack_fffffffffffff690,sourceToken,
                                (size_t)in_stack_fffffffffffff688,
                                (SmallVectorBase<slang::parsing::Token> *)
                                CONCAT17(in_stack_fffffffffffff687,
                                         CONCAT16(in_stack_fffffffffffff686,
                                                  in_stack_fffffffffffff680)));
                    std::span<const_slang::parsing::Token,_18446744073709551615UL>::
                    span<slang::SmallVector<slang::parsing::Token,_8UL>_&>
                              ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                               pSStack_370,(SmallVector<slang::parsing::Token,_8UL> *)local_378);
                    tokens_01._M_extent._M_extent_value = in_RSI._M_extent_value;
                    tokens_01._M_ptr = pTVar19;
                    in_stack_fffffffffffff687 =
                         applyMacroOps(in_RCX,tokens_01,in_stack_ffffffffffffffd8);
                    local_229 = (local_229 & 1) != 0 || (bool)in_stack_fffffffffffff687;
                    SmallVector<slang::parsing::Token,_8UL>::~SmallVector
                              ((SmallVector<slang::parsing::Token,_8UL> *)0x28dde0);
                    goto LAB_0028de25;
                  }
                }
              }
            }
          }
          SmallVectorBase<slang::parsing::Token>::push_back
                    ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650,
                     in_stack_fffffffffffff648);
        }
        else {
          bVar2 = Token::operator_cast_to_bool((Token *)0x28d93e);
          if (bVar2) {
            SmallVectorBase<slang::parsing::Token>::push_back
                      ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650,
                       in_stack_fffffffffffff648);
          }
          else {
            SmallVectorBase<slang::parsing::Token>::push_back
                      ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650,
                       in_stack_fffffffffffff648);
            bVar2 = Token::operator_cast_to_bool((Token *)0x28d994);
            if (bVar2) {
              SmallVectorBase<slang::parsing::Token>::push_back
                        ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff650,
                         in_stack_fffffffffffff648);
              Token::Token((Token *)in_stack_fffffffffffff650);
              local_228 = local_558;
              local_220 = local_550;
            }
          }
        }
      }
    }
LAB_0028de25:
    local_238 = local_238 + 1;
  } while( true );
}

Assistant:

bool Preprocessor::applyMacroOps(std::span<Token const> tokens, SmallVectorBase<Token>& dest) {
    SmallVector<Trivia, 8> emptyArgTrivia;
    SmallVector<Token, 8> stringifyBuffer;
    SmallVector<Token, 8> commentBuffer;
    Token stringify;
    Token syntheticComment;
    Token extraToAppend;
    bool anyNewMacros = false;
    bool didConcat = false;

    for (size_t i = 0; i < tokens.size(); i++) {
        Token newToken;
        bool nextDidConcat = false;

        // Once we see a `" token, we start collecting tokens into their own
        // buffer for stringification. Otherwise, just add them to the final
        // expansion buffer.
        Token token = tokens[i];
        switch (token.kind) {
            case TokenKind::MacroQuote:
            case TokenKind::MacroTripleQuote:
                if (!stringify) {
                    stringify = token;
                    stringifyBuffer.clear();

                    if (token.kind == TokenKind::MacroTripleQuote &&
                        options.languageVersion < LanguageVersion::v1800_2023) {
                        addDiag(diag::WrongLanguageVersion, token.location())
                            << toString(options.languageVersion);
                    }
                }
                else if (token.kind == stringify.kind) {
                    // all done stringifying; convert saved tokens to string
                    newToken = Lexer::stringify(*lexerStack.back(), stringify, stringifyBuffer,
                                                token);
                    stringify = Token();
                }
                else if (stringify.kind == TokenKind::MacroTripleQuote) {
                    // We found a `" inside of a triple quoted stringification.
                    // Just keep it, let it become part of the string contents.
                    newToken = token;
                }
                else {
                    // We found a `""" inside of a single quoted stringification.
                    // The LRM doesn't say what to do, but I think it makes sense to
                    // split the token, end the previous stringification, and then
                    // append the essentially empty string literal after it.
                    // This will cause an error down the line since two string literals
                    // next to each other isn't ever valid.
                    newToken = Lexer::stringify(*lexerStack.back(), stringify, stringifyBuffer,
                                                token);
                    stringify = Token();
                    extraToAppend = Token(alloc, TokenKind::StringLiteral, {}, "\"\"",
                                          token.location() + 2, ""sv);
                }
                break;
            case TokenKind::MacroPaste:
                // Paste together previous token and next token; a macro paste on either end
                // of the buffer or one that borders whitespace should be ignored.
                // This isn't specified in the standard so I'm just guessing.
                if (i == 0 || i == tokens.size() - 1 || !token.trivia().empty() ||
                    !tokens[i + 1].trivia().empty() || !emptyArgTrivia.empty()) {

                    addDiag(diag::IgnoredMacroPaste, token.location());

                    // We're ignoring this token, but don't lose its trivia or our
                    // spacing can get messed up.
                    emptyArgTrivia.append_range(token.trivia());
                }
                else if (stringify) {
                    // If this is right after the opening quote or right before the closing quote,
                    // we're trying to concatenate something with nothing.
                    if (stringifyBuffer.empty() || tokens[i + 1].kind == TokenKind::MacroQuote ||
                        tokens[i + 1].kind == TokenKind::MacroTripleQuote) {
                        addDiag(diag::IgnoredMacroPaste, token.location());
                    }
                    else {
                        newToken = Lexer::concatenateTokens(alloc, sourceManager,
                                                            stringifyBuffer.back(), tokens[i + 1]);
                        if (newToken) {
                            stringifyBuffer.pop_back();
                            ++i;
                        }
                    }
                }
                else if (syntheticComment) {
                    // Check for a *``/ to end the synthetic comment. Otherwise ignore the paste,
                    // since this is just going to become a comment anyway.
                    if (commentBuffer.back().kind == TokenKind::Star &&
                        tokens[i + 1].kind == TokenKind::Slash) {
                        commentBuffer.push_back(tokens[i + 1]);
                        i++;

                        emptyArgTrivia.append_range(syntheticComment.trivia());
                        emptyArgTrivia.push_back(
                            Lexer::commentify(alloc, sourceManager, commentBuffer));
                        syntheticComment = Token();
                    }
                }
                else {
                    // Dest cannot be empty here, though it's not easy to see why at first glance.
                    Token left = dest.back();
                    Token right = tokens[i + 1];

                    // Other tools allow concatenating a '/' with a '*' to form a block comment.
                    // This seems like utter nonsense but real world code depends on it so
                    // we have to support it as well.
                    if (left.kind == TokenKind::Slash && right.kind == TokenKind::Star) {
                        commentBuffer.clear();
                        syntheticComment = left;
                        dest.pop_back();
                        ++i;

                        commentBuffer.push_back(left.withTrivia(alloc, {}));
                        newToken = right;
                    }
                    else {
                        newToken = Lexer::concatenateTokens(alloc, sourceManager, dest.back(),
                                                            tokens[i + 1]);
                        if (newToken) {
                            dest.pop_back();
                            ++i;

                            nextDidConcat = true;
                            anyNewMacros |= newToken.kind == TokenKind::Directive &&
                                            newToken.directiveKind() == SyntaxKind::MacroUsage;
                        }
                    }
                }
                break;
            default: {
                // If last iteration we did a token concatenation, check whether this token
                // is right next to it (not leading trivia). If so, we should try to
                // continue the concatenation process.
                if (didConcat && token.trivia().empty() && emptyArgTrivia.empty()) {
                    newToken = Lexer::concatenateTokens(alloc, sourceManager, dest.back(), token);
                    if (newToken) {
                        dest.pop_back();
                        nextDidConcat = true;
                        break;
                    }
                }

                // Otherwise take the token as it is.
                newToken = token;
                break;
            }
        }

        didConcat = nextDidConcat;
        if (!newToken)
            continue;

        // If we have an empty macro argument just collect its trivia and use it on the next token
        // we find. Note that this can be left over at the end of applying ops; that's fine,
        // nothing is relying on observing this after the end of the macro's tokens.
        if (newToken.kind == TokenKind::EmptyMacroArgument) {
            emptyArgTrivia.append_range(newToken.trivia());
            continue;
        }

        if (!emptyArgTrivia.empty()) {
            emptyArgTrivia.append_range(newToken.trivia());
            newToken = newToken.withTrivia(alloc, emptyArgTrivia.copy(alloc));
            emptyArgTrivia.clear();
        }

        if (!stringify) {
            if (syntheticComment) {
                commentBuffer.push_back(newToken);
            }
            else {
                dest.push_back(newToken);
                if (extraToAppend) {
                    dest.push_back(extraToAppend);
                    extraToAppend = Token();
                }
            }
            continue;
        }

        // If this is an escaped identifier that includes a `" within it, we need to split the
        // token up to match the behavior of other simulators.
        auto raw = newToken.rawText();
        if (newToken.kind == TokenKind::Identifier && !raw.empty() && raw[0] == '\\') {
            size_t offset = raw.find("`\"");
            if (offset != std::string_view::npos) {
                // Like above, we need to handle the case of mismatched delimiters.
                // If we match, we complete the stringification. If we found a `"
                // inside a triple quoted string, just keep going. If we found a `"""
                // inside a single quoted string, split and end.
                const bool startIsTriple = stringify.kind == TokenKind::MacroTripleQuote;
                const bool endIsTriple = raw.substr(offset).starts_with(R"(`""")");
                if (startIsTriple == endIsTriple || !startIsTriple) {
                    stringifyBuffer.push_back(newToken.withRawText(alloc, raw.substr(0, offset)));

                    // Note: endToken parameter here doesn't matter,
                    // we know there is no trivia to take.
                    dest.push_back(
                        Lexer::stringify(*lexerStack.back(), stringify, stringifyBuffer, Token()));
                    stringify = Token();

                    // Now we have the unfortunate task of re-lexing the remaining stuff after the
                    // split and then appending those tokens to the destination as well.
                    SmallVector<Token, 8> splits;
                    splitTokens(newToken, offset + (endIsTriple ? 4 : 2), splits);
                    anyNewMacros |= applyMacroOps(splits, dest);
                    continue;
                }
            }
        }

        stringifyBuffer.push_back(newToken);
    }

    if (stringify)
        addDiag(diag::ExpectedMacroStringifyEnd, stringify.location());

    return anyNewMacros;
}